

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_scope.c
# Opt level: O3

void l2_scope_escape_scope(l2_scope_guid src)

{
  _l2_scope *p_Var1;
  _l2_scope *p_Var2;
  _l2_scope **pp_Var3;
  l2_scope_guid p_Var4;
  
  l2_assert_func((long)src,L2_INTERNAL_ERROR_NULL_POINTER,"l2_scope_escape_scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_scope.c"
                 ,0x61);
  l2_scope_lower_finalize_recursion(src->lower_p);
  l2_symbol_table_destroy(src->symbol_table_p);
  p_Var1 = src->upper_p;
  if (p_Var1 != (_l2_scope *)0x0) {
    p_Var2 = p_Var1->lower_p;
    if (p_Var1->lower_p == src) {
      pp_Var3 = &p_Var1->lower_p;
    }
    else {
      do {
        p_Var4 = p_Var2;
        p_Var2 = p_Var4->coor_p;
      } while (p_Var2 != src);
      pp_Var3 = &p_Var4->coor_p;
    }
    *pp_Var3 = src->coor_p;
    l2_storage_mem_delete(g_parser_p->storage_p,src);
    return;
  }
  l2_scope_destroy(src);
  return;
}

Assistant:

void l2_scope_escape_scope(l2_scope_guid src) {
    l2_assert(src, L2_INTERNAL_ERROR_NULL_POINTER);
    l2_scope_lower_finalize_recursion(src->lower_p);
    l2_symbol_table_destroy(src->symbol_table_p);

    l2_scope *scope_upper_p = src->upper_p;
    if (!scope_upper_p) { /* global scope */
        l2_scope_destroy(src);
        return;
    }

    l2_scope *scope_p;
    if (scope_upper_p->lower_p == src) {
        scope_upper_p->lower_p = src->coor_p;

    } else {
        scope_p = scope_upper_p->lower_p;
        while (scope_p->coor_p != src) scope_p = scope_p->coor_p;
        scope_p->coor_p = src->coor_p;
    }

    l2_storage_mem_delete(g_parser_p->storage_p, src);
}